

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UCharCharacterIterator::move(UCharCharacterIterator *this,int32_t delta,EOrigin origin)

{
  int32_t *piVar1;
  int iVar2;
  int iVar3;
  
  if (origin == kEnd) {
    iVar2 = (this->super_CharacterIterator).end;
  }
  else {
    if (origin == kCurrent) {
      piVar1 = &(this->super_CharacterIterator).pos;
      *piVar1 = *piVar1 + delta;
      goto LAB_003341f4;
    }
    if (origin != kStart) goto LAB_003341f4;
    iVar2 = (this->super_CharacterIterator).begin;
  }
  (this->super_CharacterIterator).pos = delta + iVar2;
LAB_003341f4:
  iVar2 = (this->super_CharacterIterator).pos;
  iVar3 = (this->super_CharacterIterator).begin;
  if ((iVar2 < iVar3) || (iVar3 = (this->super_CharacterIterator).end, iVar3 < iVar2)) {
    (this->super_CharacterIterator).pos = iVar3;
  }
  return (this->super_CharacterIterator).pos;
}

Assistant:

int32_t
UCharCharacterIterator::move(int32_t delta, CharacterIterator::EOrigin origin) {
    switch(origin) {
    case kStart:
        pos = begin + delta;
        break;
    case kCurrent:
        pos += delta;
        break;
    case kEnd:
        pos = end + delta;
        break;
    default:
        break;
    }

    if(pos < begin) {
        pos = begin;
    } else if(pos > end) {
        pos = end;
    }

    return pos;
}